

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O1

void test_request_permission_callback(ne_core_permission_event *event,void *user_data)

{
  ne_core_permission_state nVar1;
  uint64_t uVar2;
  uint64_t *puVar3;
  byte bVar4;
  int64_t iVar5;
  uint64_t uVar6;
  bool bVar7;
  
  uVar6 = event->permission;
  uVar2 = *(uint64_t *)((long)user_data + 8);
  if (uVar6 != uVar2) {
    (*ne_core_error)((uint64_t *)0x0,0,
                     "/workspace/llm4binary/github/license_c_cmakelists/TrevorSundberg[P]ne/packages/test/test.cpp"
                     ,0x21d,"TEST_EXPECT(event->permission == table->permission) failed\n");
  }
  *(byte *)((long)user_data + 0x48) = *(byte *)((long)user_data + 0x48) & uVar6 == uVar2;
  nVar1 = event->current_state;
  if (nVar1 == ne_core_permission_state_prompt) {
    (*ne_core_error)((uint64_t *)0x0,0,
                     "/workspace/llm4binary/github/license_c_cmakelists/TrevorSundberg[P]ne/packages/test/test.cpp"
                     ,0x21e,
                     "TEST_EXPECT(event->current_state != ne_core_permission_state_prompt) failed\n"
                    );
  }
  bVar4 = *(byte *)((long)user_data + 0x48) & 1;
  if (nVar1 == ne_core_permission_state_prompt) {
    bVar4 = 0;
  }
  *(byte *)((long)user_data + 0x48) = bVar4;
  nVar1 = event->previous_state;
  if (nVar1 != ne_core_permission_state_prompt) {
    (*ne_core_error)((uint64_t *)0x0,0,
                     "/workspace/llm4binary/github/license_c_cmakelists/TrevorSundberg[P]ne/packages/test/test.cpp"
                     ,0x21f,
                     "TEST_EXPECT(event->previous_state == ne_core_permission_state_prompt) failed\n"
                    );
  }
  *(byte *)((long)user_data + 0x48) =
       *(byte *)((long)user_data + 0x48) & nVar1 == ne_core_permission_state_prompt;
  nVar1 = event->current_state;
  if (nVar1 == ne_core_permission_state_granted) {
    puVar3 = *(uint64_t **)((long)user_data + 0x40);
    if (puVar3 != (uint64_t *)0x0) {
      *puVar3 = 0;
    }
    (*ne_core_query_permission)
              (puVar3,*(uint64_t *)((long)user_data + 8),test_query_permission_granted_callback,
               user_data);
    if (*(uint64_t **)((long)user_data + 0x40) == (uint64_t *)0x0) {
      return;
    }
    uVar6 = **(uint64_t **)((long)user_data + 0x40);
    bVar7 = uVar6 == 1;
    if (bVar7) goto LAB_00108f99;
    iVar5 = 0x229;
  }
  else {
    if (nVar1 != ne_core_permission_state_denied) {
      (*ne_core_error)((uint64_t *)0x0,0,
                       "/workspace/llm4binary/github/license_c_cmakelists/TrevorSundberg[P]ne/packages/test/test.cpp"
                       ,0x22d,
                       "TEST_EXPECT(event->current_state == ne_core_permission_state_denied) failed\n"
                      );
    }
    *(byte *)((long)user_data + 0x48) =
         *(byte *)((long)user_data + 0x48) & nVar1 == ne_core_permission_state_denied;
    puVar3 = *(uint64_t **)((long)user_data + 0x40);
    if (puVar3 != (uint64_t *)0x0) {
      *puVar3 = 0;
    }
    (*ne_core_query_permission)
              (puVar3,*(uint64_t *)((long)user_data + 8),test_query_permission_denied_callback,
               user_data);
    if (*(uint64_t **)((long)user_data + 0x40) == (uint64_t *)0x0) {
      return;
    }
    uVar6 = **(uint64_t **)((long)user_data + 0x40);
    bVar7 = uVar6 == 1;
    if (bVar7) goto LAB_00108f99;
    iVar5 = 0x235;
  }
  (*ne_core_error)((uint64_t *)0x0,uVar6,
                   "/workspace/llm4binary/github/license_c_cmakelists/TrevorSundberg[P]ne/packages/test/test.cpp"
                   ,iVar5,"TEST_EXPECT_RESULT(NE_CORE_RESULT_SUCCESS) failed\n");
LAB_00108f99:
  *(byte *)((long)user_data + 0x48) = *(byte *)((long)user_data + 0x48) & bVar7;
  return;
}

Assistant:

static void test_request_permission_callback(
    const ne_core_permission_event *event, const void *user_data)
{
  auto table = static_cast<test_table *>(const_cast<void *>(user_data));
  TEST_EXPECT(event->permission == table->permission);
  TEST_EXPECT(event->current_state != ne_core_permission_state_prompt);
  TEST_EXPECT(event->previous_state == ne_core_permission_state_prompt);

  if (event->current_state == ne_core_permission_state_granted)
  {
    // We SHOULD have permission.
    TEST_CLEAR_RESULT();
    ne_core_query_permission(table->result,
                             table->permission,
                             &test_query_permission_granted_callback,
                             table);
    TEST_EXPECT_RESULT(NE_CORE_RESULT_SUCCESS);
  }
  else
  {
    TEST_EXPECT(event->current_state == ne_core_permission_state_denied);

    // We SHOULD NOT have permission.
    TEST_CLEAR_RESULT();
    ne_core_query_permission(table->result,
                             table->permission,
                             &test_query_permission_denied_callback,
                             table);
    TEST_EXPECT_RESULT(NE_CORE_RESULT_SUCCESS);
  }
}